

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O2

void fill_inverse_cmap(j_decompress_ptr cinfo,int c0,int c1,int c2)

{
  byte bVar1;
  byte bVar2;
  _func_void_j_decompress_ptr *p_Var3;
  JSAMPARRAY ppJVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long *plVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  byte *pbVar31;
  long lVar32;
  long lVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  JSAMPLE colorlist [256];
  INT32 mindist [256];
  byte local_9b8 [128];
  byte abStack_938 [256];
  long local_838 [257];
  
  p_Var3 = cinfo->cquantize[1].finish_pass;
  uVar8 = c0 * 8;
  uVar26 = (long)(int)uVar8 & 0xffffffffffffffe0U | 4;
  uVar9 = c1 * 4;
  uVar28 = (long)(int)uVar9 & 0xffffffffffffffe0U | 2;
  uVar10 = c2 * 8;
  uVar30 = (long)(int)uVar10 & 0xffffffffffffffe0U | 4;
  uVar18 = (long)(int)uVar8 | 0x1c;
  iVar5 = (int)uVar26;
  uVar22 = (uint)uVar18;
  uVar36 = (long)(int)uVar9 | 0x1e;
  iVar6 = (int)uVar28;
  iVar14 = (int)uVar36;
  uVar37 = (long)(int)uVar10 | 0x1c;
  iVar7 = (int)uVar30;
  iVar20 = (int)uVar37;
  uVar15 = 0;
  uVar24 = (ulong)(uint)cinfo->actual_number_of_colors;
  if (cinfo->actual_number_of_colors < 1) {
    uVar24 = uVar15;
  }
  lVar32 = 0x7fffffff;
  do {
    if (uVar24 == uVar15) {
      uVar22 = 0;
      for (uVar15 = 0; uVar24 != uVar15; uVar15 = uVar15 + 1) {
        if (local_838[uVar15] <= lVar32) {
          lVar23 = (long)(int)uVar22;
          uVar22 = uVar22 + 1;
          abStack_938[lVar23] = (byte)uVar15;
        }
      }
      plVar12 = local_838;
      for (iVar14 = 0x7f; -1 < iVar14; iVar14 = iVar14 + -1) {
        *plVar12 = 0x7fffffff;
        plVar12 = plVar12 + 1;
      }
      uVar15 = 0;
      uVar24 = (ulong)uVar22;
      if ((int)uVar22 < 1) {
        uVar24 = uVar15;
      }
      for (; uVar15 != uVar24; uVar15 = uVar15 + 1) {
        bVar1 = abStack_938[uVar15];
        ppJVar4 = cinfo->colormap;
        lVar23 = ((long)iVar5 - (ulong)(*ppJVar4)[bVar1]) * 2;
        bVar2 = ppJVar4[1][bVar1];
        lVar32 = ((long)iVar6 - (ulong)bVar2) * 3;
        lVar21 = (long)iVar7 - (ulong)ppJVar4[2][bVar1];
        lVar32 = lVar21 * lVar21 + lVar32 * lVar32 + lVar23 * lVar23;
        lVar23 = ((long)iVar5 - (ulong)(*ppJVar4)[bVar1]) * 0x40 + 0x100;
        plVar12 = local_838;
        pbVar31 = local_9b8;
        for (iVar14 = 3; -1 < iVar14; iVar14 = iVar14 + -1) {
          lVar13 = ((long)iVar6 - (ulong)bVar2) * 0x48 + 0x90;
          lVar27 = lVar32;
          for (iVar20 = 7; lVar33 = lVar21 * 0x10 + 0x40, lVar35 = lVar27, iVar29 = 3, -1 < iVar20;
              iVar20 = iVar20 + -1) {
            for (; -1 < iVar29; iVar29 = iVar29 + -1) {
              if (lVar35 < *plVar12) {
                *plVar12 = lVar35;
                *pbVar31 = bVar1;
              }
              lVar35 = lVar35 + lVar33;
              plVar12 = plVar12 + 1;
              pbVar31 = pbVar31 + 1;
              lVar33 = lVar33 + 0x80;
            }
            lVar27 = lVar27 + lVar13;
            lVar13 = lVar13 + 0x120;
          }
          lVar32 = lVar32 + lVar23;
          lVar23 = lVar23 + 0x200;
        }
      }
      pbVar31 = local_9b8;
      for (uVar24 = 0; uVar24 != 4; uVar24 = uVar24 + 1) {
        lVar32 = *(long *)(p_Var3 + (uVar24 | (long)(int)(c0 & 0xfffffffc)) * 8) +
                 (long)(int)(c1 & 0xfffffff8) * 0x40 + (ulong)((uint)c2 >> 2) * 8;
        for (lVar23 = 0; lVar23 != 8; lVar23 = lVar23 + 1) {
          for (lVar21 = 0; (int)lVar21 != 4; lVar21 = lVar21 + 1) {
            *(ushort *)(lVar32 + lVar21 * 2) = pbVar31[lVar21] + 1;
          }
          pbVar31 = pbVar31 + lVar21;
          lVar32 = lVar32 + 0x40;
        }
      }
      return;
    }
    ppJVar4 = cinfo->colormap;
    bVar1 = (*ppJVar4)[uVar15];
    uVar16 = (ulong)bVar1;
    if ((int)(uint)bVar1 < iVar5) {
      lVar23 = (uVar16 - uVar26) * 2;
      lVar23 = lVar23 * lVar23;
      uVar34 = uVar22;
    }
    else if ((int)uVar22 < (int)(uint)bVar1) {
      lVar23 = (uVar16 - uVar18) * 2;
      lVar23 = lVar23 * lVar23;
      uVar34 = uVar8 & 0xffffffe0 | 4;
    }
    else {
      uVar34 = uVar8 & 0xffffffe0 | 4;
      if ((uint)bVar1 <= iVar5 + uVar22 >> 1) {
        uVar34 = uVar22;
      }
      lVar23 = 0;
    }
    bVar1 = ppJVar4[1][uVar15];
    uVar11 = (ulong)bVar1;
    if ((int)(uint)bVar1 < iVar6) {
      lVar21 = (uVar11 - uVar28) * 3;
      lVar23 = lVar23 + lVar21 * lVar21;
LAB_0023b019:
      uVar17 = uVar9 | 0x1e;
    }
    else if (iVar14 < (int)(uint)bVar1) {
      lVar21 = (uVar11 - uVar36) * 3;
      lVar23 = lVar23 + lVar21 * lVar21;
      uVar17 = uVar9 & 0xffffffe0 | 2;
    }
    else {
      uVar17 = uVar9 & 0xffffffe0 | 2;
      if ((uint)bVar1 <= (uint)(iVar6 + iVar14) >> 1) goto LAB_0023b019;
    }
    bVar1 = ppJVar4[2][uVar15];
    uVar25 = (ulong)bVar1;
    if ((int)(uint)bVar1 < iVar7) {
      lVar21 = uVar25 - uVar30;
      lVar23 = lVar23 + lVar21 * lVar21;
LAB_0023b05c:
      uVar19 = uVar10 | 0x1c;
    }
    else if (iVar20 < (int)(uint)bVar1) {
      lVar21 = uVar25 - uVar37;
      lVar23 = lVar23 + lVar21 * lVar21;
      uVar19 = uVar10 & 0xffffffe0 | 4;
    }
    else {
      uVar19 = uVar10 & 0xffffffe0 | 4;
      if ((uint)bVar1 <= (uint)(iVar7 + iVar20) >> 1) goto LAB_0023b05c;
    }
    lVar21 = (uVar16 - (long)(int)uVar34) * 2;
    lVar13 = (uVar11 - (long)(int)uVar17) * 3;
    lVar21 = (uVar25 - (long)(int)uVar19) * (uVar25 - (long)(int)uVar19) +
             lVar13 * lVar13 + lVar21 * lVar21;
    local_838[uVar15] = lVar23;
    if (lVar21 < lVar32) {
      lVar32 = lVar21;
    }
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

LOCAL(void)
fill_inverse_cmap (j_decompress_ptr cinfo, int c0, int c1, int c2)
/* Fill the inverse-colormap entries in the update box that contains */
/* histogram cell c0/c1/c2.  (Only that one cell MUST be filled, but */
/* we can fill as many others as we wish.) */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  int minc0, minc1, minc2;	/* lower left corner of update box */
  int ic0, ic1, ic2;
  register JSAMPLE * cptr;	/* pointer into bestcolor[] array */
  register histptr cachep;	/* pointer into main cache array */
  /* This array lists the candidate colormap indexes. */
  JSAMPLE colorlist[MAXNUMCOLORS];
  int numcolors;		/* number of candidate colors */
  /* This array holds the actually closest colormap index for each cell. */
  JSAMPLE bestcolor[BOX_C0_ELEMS * BOX_C1_ELEMS * BOX_C2_ELEMS];

  /* Convert cell coordinates to update box ID */
  c0 >>= BOX_C0_LOG;
  c1 >>= BOX_C1_LOG;
  c2 >>= BOX_C2_LOG;

  /* Compute true coordinates of update box's origin corner.
   * Actually we compute the coordinates of the center of the corner
   * histogram cell, which are the lower bounds of the volume we care about.
   */
  minc0 = (c0 << BOX_C0_SHIFT) + ((1 << C0_SHIFT) >> 1);
  minc1 = (c1 << BOX_C1_SHIFT) + ((1 << C1_SHIFT) >> 1);
  minc2 = (c2 << BOX_C2_SHIFT) + ((1 << C2_SHIFT) >> 1);
  
  /* Determine which colormap entries are close enough to be candidates
   * for the nearest entry to some cell in the update box.
   */
  numcolors = find_nearby_colors(cinfo, minc0, minc1, minc2, colorlist);

  /* Determine the actually nearest colors. */
  find_best_colors(cinfo, minc0, minc1, minc2, numcolors, colorlist,
		   bestcolor);

  /* Save the best color numbers (plus 1) in the main cache array */
  c0 <<= BOX_C0_LOG;		/* convert ID back to base cell indexes */
  c1 <<= BOX_C1_LOG;
  c2 <<= BOX_C2_LOG;
  cptr = bestcolor;
  for (ic0 = 0; ic0 < BOX_C0_ELEMS; ic0++) {
    for (ic1 = 0; ic1 < BOX_C1_ELEMS; ic1++) {
      cachep = & histogram[c0+ic0][c1+ic1][c2];
      for (ic2 = 0; ic2 < BOX_C2_ELEMS; ic2++) {
	*cachep++ = (histcell) (GETJSAMPLE(*cptr++) + 1);
      }
    }
  }
}